

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

String * __thiscall
dxil_spv::get_string_metadata_abi_cxx11_
          (String *__return_storage_ptr__,dxil_spv *this,MDNode *node,uint index)

{
  MDOperand *md;
  MDString *this_00;
  String *__str;
  
  md = LLVMBC::MDNode::getOperand((MDNode *)this,(uint)node);
  this_00 = LLVMBC::cast<LLVMBC::MDString>(md);
  __str = LLVMBC::MDString::getString_abi_cxx11_(this_00);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
  basic_string(__return_storage_ptr__,__str);
  return __return_storage_ptr__;
}

Assistant:

static String get_string_metadata(const llvm::MDNode *node, unsigned index)
{
#ifdef HAVE_LLVMBC
	return llvm::cast<llvm::MDString>(node->getOperand(index))->getString();
#else
	std::string tmp = llvm::cast<llvm::MDString>(node->getOperand(index))->getString();
	String str(tmp.begin(), tmp.end());
	return str;
#endif
}